

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Consume(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_8e8;
  string *local_768;
  LogMessage local_760;
  LogMessage local_5e0;
  string *local_460;
  LogMessage local_458;
  LogMessage local_2d8;
  string *local_158;
  undefined1 local_150 [8];
  StringPiece input;
  allocator local_129;
  string local_128 [8];
  string s;
  string local_108 [8];
  string word;
  undefined1 local_e8 [8];
  RE2 r;
  
  RE2::RE2((RE2 *)local_e8,"\\s*(\\w+)");
  std::__cxx11::string::string(local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"   aaa b!@#$@#$cccc",&local_129);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  StringPiece::StringPiece((StringPiece *)local_150,(string *)local_128);
  local_158 = local_108;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    ((StringPiece *)local_150,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_158);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xed);
    poVar2 = LogMessage::stream(&local_2d8);
    std::operator<<(poVar2,"Check failed: RE2::Consume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2d8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"aaa");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_458,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xee);
    poVar2 = LogMessage::stream(&local_458);
    poVar2 = std::operator<<(poVar2,"Check failed: (word) == (\"aaa\")");
    poVar2 = std::operator<<(poVar2," input: ");
    operator<<(poVar2,(StringPiece *)local_150);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_458);
  }
  local_460 = local_108;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    ((StringPiece *)local_150,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_460);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_5e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xef);
    poVar2 = LogMessage::stream(&local_5e0);
    std::operator<<(poVar2,"Check failed: RE2::Consume(&input, r, &word)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5e0);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108,"b");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_760,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xf0);
    poVar2 = LogMessage::stream(&local_760);
    poVar2 = std::operator<<(poVar2,"Check failed: (word) == (\"b\")");
    poVar2 = std::operator<<(poVar2," input: ");
    operator<<(poVar2,(StringPiece *)local_150);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_760);
  }
  local_768 = local_108;
  bVar1 = RE2::Consume<std::__cxx11::string*>
                    ((StringPiece *)local_150,(RE2 *)local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_768);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_8e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xf1);
    poVar2 = LogMessage::stream(&local_8e8);
    poVar2 = std::operator<<(poVar2,"Check failed: ! RE2::Consume(&input, r, &word)");
    poVar2 = std::operator<<(poVar2," input: ");
    operator<<(poVar2,(StringPiece *)local_150);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_8e8);
  }
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_108);
  RE2::~RE2((RE2 *)local_e8);
  return;
}

Assistant:

TEST(RE2, Consume) {
  VLOG(1) << "TestConsume";

  RE2 r("\\s*(\\w+)");    // matches a word, possibly proceeded by whitespace
  string word;

  string s("   aaa b!@#$@#$cccc");
  StringPiece input(s);

  CHECK(RE2::Consume(&input, r, &word));
  CHECK_EQ(word, "aaa") << " input: " << input;
  CHECK(RE2::Consume(&input, r, &word));
  CHECK_EQ(word, "b") << " input: " << input;
  CHECK(! RE2::Consume(&input, r, &word)) << " input: " << input;
}